

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  Node *pNVar2;
  bool bVar3;
  Node *next;
  Node *pNStack_20;
  int level;
  Node *x;
  char **key_local;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_local;
  
  pNVar2 = this->head_;
  iVar1 = GetMaxHeight(this);
  next._4_4_ = iVar1 + -1;
  while( true ) {
    pNStack_20 = pNVar2;
    bVar3 = true;
    if (pNStack_20 != this->head_) {
      iVar1 = MemTable::KeyComparator::operator()(&this->compare_,pNStack_20->key,*key);
      bVar3 = iVar1 < 0;
    }
    if (!bVar3) break;
    pNVar2 = Node::Next(pNStack_20,next._4_4_);
    if ((pNVar2 == (Node *)0x0) ||
       (iVar1 = MemTable::KeyComparator::operator()(&this->compare_,pNVar2->key,*key), -1 < iVar1))
    {
      if (next._4_4_ == 0) {
        return pNStack_20;
      }
      next._4_4_ = next._4_4_ + -1;
      pNVar2 = pNStack_20;
    }
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/skiplist.h"
                ,0x121,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}